

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_fast_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int originalSize)

{
  char *pcVar1;
  size_t dictSize;
  size_t sVar2;
  bool bVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  LZ4_byte *pLVar9;
  LZ4_byte *pLVar10;
  LZ4_byte *pLVar11;
  ushort *__src;
  ulong uVar12;
  LZ4_byte *__src_00;
  uint uVar13;
  size_t l;
  long lVar14;
  ulong uVar15;
  ushort *puVar16;
  size_t l_1;
  LZ4_byte *__n;
  char cVar17;
  int local_60;
  
  dictSize = (LZ4_streamDecode->internal_donotuse).prefixSize;
  if (dictSize == 0) {
    iVar6 = LZ4_decompress_fast(source,dest,originalSize);
  }
  else {
    if ((LZ4_streamDecode->internal_donotuse).prefixEnd == (LZ4_byte *)dest) {
      sVar2 = (LZ4_streamDecode->internal_donotuse).extDictSize;
      lVar7 = (long)originalSize;
      pcVar1 = dest + lVar7;
      lVar8 = (long)dest - dictSize;
      pLVar10 = (LZ4_streamDecode->internal_donotuse).externalDict;
      puVar16 = (ushort *)source;
      do {
        uVar4 = *puVar16;
        __src = (ushort *)((long)puVar16 + 1);
        uVar13 = (uint)(byte)((byte)uVar4 >> 4);
        uVar15 = (ulong)uVar13;
        if (uVar13 == 0xf) {
          lVar14 = 0;
          do {
            uVar5 = *__src;
            __src = (ushort *)((long)__src + 1);
            lVar14 = lVar14 + (ulong)(byte)uVar5;
          } while ((ulong)(byte)uVar5 == 0xff);
          uVar15 = lVar14 + 0xf;
        }
        cVar17 = '\0';
        if ((ulong)((long)pcVar1 - (long)dest) < uVar15) {
          cVar17 = '\x01';
LAB_003221e7:
          bVar3 = false;
        }
        else {
          memmove(dest,__src,uVar15);
          dest = dest + uVar15;
          __src = (ushort *)((long)__src + uVar15);
          bVar3 = true;
          if ((ulong)((long)pcVar1 - (long)dest) < 0xc) {
            cVar17 = (dest == pcVar1) * '\x02' + '\x01';
            goto LAB_003221e7;
          }
        }
        puVar16 = __src;
        if (bVar3) {
          uVar15 = (ulong)((byte)uVar4 & 0xf);
          puVar16 = __src + 1;
          if (uVar15 == 0xf) {
            lVar14 = 0;
            do {
              uVar4 = *puVar16;
              puVar16 = (ushort *)((long)puVar16 + 1);
              lVar14 = lVar14 + (ulong)(byte)uVar4;
            } while ((ulong)(byte)uVar4 == 0xff);
            uVar15 = lVar14 + 0xf;
          }
          __n = (LZ4_byte *)(uVar15 + 4);
          cVar17 = '\x01';
          if (__n <= pcVar1 + -(long)dest) {
            uVar15 = (ulong)*__src;
            uVar12 = (long)dest - lVar8;
            if (uVar15 <= uVar12 + sVar2) {
              if (uVar12 < uVar15) {
                __src_00 = pLVar10 + (uVar12 - uVar15) + sVar2;
                pLVar11 = pLVar10 + (sVar2 - (long)__src_00);
                pLVar9 = __n + -(long)pLVar11;
                if (__n < pLVar11) {
                  memmove(dest,__src_00,(size_t)__n);
                  pLVar9 = (LZ4_byte *)0x0;
                  pLVar11 = __n;
                }
                else {
                  memmove(dest,__src_00,(size_t)pLVar11);
                }
                dest = dest + (long)pLVar11;
                lVar14 = lVar8;
                __n = pLVar9;
              }
              else {
                lVar14 = (long)dest - uVar15;
              }
              if (__n != (LZ4_byte *)0x0) {
                pLVar11 = (LZ4_byte *)0x0;
                do {
                  dest[(long)pLVar11] = pLVar11[lVar14];
                  pLVar11 = pLVar11 + 1;
                } while (__n != pLVar11);
              }
            }
            if (uVar15 <= uVar12 + sVar2) {
              dest = dest + (long)__n;
              cVar17 = (ulong)((long)pcVar1 - (long)dest) < 5;
            }
          }
        }
        if (cVar17 != '\0') {
          if (cVar17 == '\x03') {
            local_60 = (int)source;
            local_60 = (int)puVar16 - local_60;
          }
          else {
            local_60 = -1;
          }
          if (local_60 < 1) {
            return local_60;
          }
          (LZ4_streamDecode->internal_donotuse).prefixSize =
               (LZ4_streamDecode->internal_donotuse).prefixSize + lVar7;
          (LZ4_streamDecode->internal_donotuse).prefixEnd =
               (LZ4_streamDecode->internal_donotuse).prefixEnd + lVar7;
          return local_60;
        }
      } while( true );
    }
    (LZ4_streamDecode->internal_donotuse).extDictSize = dictSize;
    pLVar10 = (LZ4_streamDecode->internal_donotuse).prefixEnd + -dictSize;
    (LZ4_streamDecode->internal_donotuse).externalDict = pLVar10;
    iVar6 = LZ4_decompress_fast_extDict(source,dest,originalSize,pLVar10,dictSize);
  }
  if (0 < iVar6) {
    (LZ4_streamDecode->internal_donotuse).prefixSize = (long)originalSize;
    (LZ4_streamDecode->internal_donotuse).prefixEnd = (LZ4_byte *)(dest + originalSize);
  }
  return iVar6;
}

Assistant:

LZ4_FORCE_O2 int
LZ4_decompress_fast_continue (LZ4_streamDecode_t* LZ4_streamDecode,
                        const char* source, char* dest, int originalSize)
{
    LZ4_streamDecode_t_internal* const lz4sd =
        (assert(LZ4_streamDecode!=NULL), &LZ4_streamDecode->internal_donotuse);
    int result;

    DEBUGLOG(5, "LZ4_decompress_fast_continue (toDecodeSize=%i)", originalSize);
    assert(originalSize >= 0);

    if (lz4sd->prefixSize == 0) {
        DEBUGLOG(5, "first invocation : no prefix nor extDict");
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_fast(source, dest, originalSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)originalSize;
        lz4sd->prefixEnd = (BYTE*)dest + originalSize;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        DEBUGLOG(5, "continue using existing prefix");
        result = LZ4_decompress_unsafe_generic(
                        (const BYTE*)source, (BYTE*)dest, originalSize,
                        lz4sd->prefixSize,
                        lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)originalSize;
        lz4sd->prefixEnd  += originalSize;
    } else {
        DEBUGLOG(5, "prefix becomes extDict");
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_fast_extDict(source, dest, originalSize,
                                             lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)originalSize;
        lz4sd->prefixEnd  = (BYTE*)dest + originalSize;
    }

    return result;
}